

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

__pid_t Fl::wait(void *__stat_loc)

{
  _func_void_void_ptr **pp_Var1;
  void **ppvVar2;
  Timeout **ppTVar3;
  Timeout *pTVar4;
  int iVar5;
  int extraout_EAX;
  Check *checkp;
  double in_XMM0_Qa;
  double dVar6;
  
  do_widget_deletion();
  if (first_timeout == (Timeout *)0x0) {
    reset_clock = 0;
  }
  else {
    elapse_timeouts();
    while ((pTVar4 = first_timeout, first_timeout != (Timeout *)0x0 && (first_timeout->time <= 0.0))
          ) {
      pp_Var1 = &first_timeout->cb;
      ppvVar2 = &first_timeout->arg;
      ppTVar3 = &first_timeout->next;
      missed_timeout_by = first_timeout->time;
      first_timeout = first_timeout->next;
      *ppTVar3 = free_timeout;
      free_timeout = pTVar4;
      (**pp_Var1)(*ppvVar2);
    }
  }
  if (next_check == first_check) {
    while (next_check != (Check *)0x0) {
      ppvVar2 = &next_check->arg;
      pp_Var1 = &next_check->cb;
      next_check = next_check->next;
      (**pp_Var1)(*ppvVar2);
    }
    next_check = first_check;
  }
  if (idle != (_func_void *)0x0) {
    if (in_idle == 0) {
      in_idle = 1;
      (*idle)();
      in_idle = 0;
    }
    if (idle != (_func_void *)0x0) {
      in_XMM0_Qa = 0.0;
    }
  }
  if ((first_timeout != (Timeout *)0x0) && (first_timeout->time < in_XMM0_Qa)) {
    in_XMM0_Qa = first_timeout->time;
  }
  if (in_XMM0_Qa <= 0.0) {
    fl_wait(0.0);
    flush();
    iVar5 = extraout_EAX;
  }
  else {
    flush();
    dVar6 = in_XMM0_Qa;
    if ((in_idle & 1) == 0) {
      dVar6 = 0.0;
    }
    if (idle != (_func_void *)0x0) {
      in_XMM0_Qa = dVar6;
    }
    iVar5 = fl_wait(in_XMM0_Qa);
  }
  return iVar5;
}

Assistant:

double Fl::wait(double time_to_wait) {
  // delete all widgets that were listed during callbacks
  do_widget_deletion();

#ifdef WIN32

  return fl_wait(time_to_wait);

#elif defined(__APPLE__)

  run_checks();
  return fl_mac_flush_and_wait(time_to_wait);

#else

  if (first_timeout) {
    elapse_timeouts();
    Timeout *t;
    while ((t = first_timeout)) {
      if (t->time > 0) break;
      // The first timeout in the array has expired.
      missed_timeout_by = t->time;
      // We must remove timeout from array before doing the callback:
      void (*cb)(void*) = t->cb;
      void *argp = t->arg;
      first_timeout = t->next;
      t->next = free_timeout;
      free_timeout = t;
      // Now it is safe for the callback to do add_timeout:
      cb(argp);
    }
  } else {
    reset_clock = 1; // we are not going to check the clock
  }
  run_checks();
//  if (idle && !fl_ready()) {
  if (idle) {
    if (!in_idle) {
      in_idle = 1;
      idle();
      in_idle = 0;
    }
    // the idle function may turn off idle, we can then wait:
    if (idle) time_to_wait = 0.0;
  }
  if (first_timeout && first_timeout->time < time_to_wait)
    time_to_wait = first_timeout->time;
  if (time_to_wait <= 0.0) {
    // do flush second so that the results of events are visible:
    int ret = fl_wait(0.0);
    flush();
    return ret;
  } else {
    // do flush first so that user sees the display:
    flush();
    if (idle && !in_idle) // 'idle' may have been set within flush()
      time_to_wait = 0.0;
    return fl_wait(time_to_wait);
  }
#endif
}